

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Matrix * __thiscall Layer::get(Matrix *__return_storage_ptr__,Layer *this)

{
  size_type sVar1;
  const_reference this_00;
  double *pdVar2;
  double dVar3;
  undefined4 local_20;
  uint i;
  Layer *this_local;
  Matrix *mat;
  
  sVar1 = std::vector<Perceptron,_std::allocator<Perceptron>_>::size(&this->m_perceptrons);
  Matrix::Matrix(__return_storage_ptr__,1,(uint)sVar1);
  for (local_20 = 0;
      sVar1 = std::vector<Perceptron,_std::allocator<Perceptron>_>::size(&this->m_perceptrons),
      local_20 < sVar1; local_20 = local_20 + 1) {
    this_00 = std::vector<Perceptron,_std::allocator<Perceptron>_>::operator[]
                        (&this->m_perceptrons,(ulong)local_20);
    dVar3 = Perceptron::get_output(this_00);
    pdVar2 = Matrix::set(__return_storage_ptr__,0,local_20);
    *pdVar2 = dVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Layer::get() const{
    Matrix mat(1, m_perceptrons.size());

    for(uint i=0;i<m_perceptrons.size();++i) mat.set(0, i)=m_perceptrons[i].get_output();

    return mat;
}